

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall
tchecker::system::system_builder_t::visit(system_builder_t *this,sync_declaration_t *d)

{
  system_t *psVar1;
  bool bVar2;
  __normal_iterator<const_std::shared_ptr<tchecker::parsing::sync_constraint_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>_>
  *p_Var3;
  element_type *peVar4;
  process_declaration_t *this_00;
  string *psVar5;
  event_declaration_t *this_01;
  attributes_t *attributes;
  attributes_t local_b8;
  sync_strength_t local_7c;
  event_id_t local_78;
  process_id_t local_74;
  event_id_t event;
  process_id_t pid;
  shared_ptr<tchecker::parsing::sync_constraint_t> *c;
  __normal_iterator<const_std::shared_ptr<tchecker::parsing::sync_constraint_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>_>
  __end2;
  __normal_iterator<const_std::shared_ptr<tchecker::parsing::sync_constraint_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>_>
  __begin2;
  range_t<__gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::sync_constraint_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>_>,___gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::sync_constraint_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>_>_>
  local_48;
  range_t<__gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::sync_constraint_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>_>,___gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::sync_constraint_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>_>_>
  *local_38;
  range_t<__gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::sync_constraint_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>_>,___gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::sync_constraint_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>_>_>
  *__range2;
  vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
  v;
  sync_declaration_t *d_local;
  system_builder_t *this_local;
  
  v.
  super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)d;
  std::
  vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
  ::vector((vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
            *)&__range2);
  local_48 = parsing::sync_declaration_t::sync_constraints
                       ((sync_declaration_t *)
                        v.
                        super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_38 = &local_48;
  p_Var3 = range_t<__gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::sync_constraint_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>_>,___gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::sync_constraint_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>_>_>
           ::begin(local_38);
  __end2._M_current = p_Var3->_M_current;
  p_Var3 = range_t<__gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::sync_constraint_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>_>,___gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::sync_constraint_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>_>_>
           ::end(local_38);
  c = p_Var3->_M_current;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<tchecker::parsing::sync_constraint_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>_>
                                *)&c);
    if (!bVar2) break;
    _event = (__shared_ptr_access<tchecker::parsing::sync_constraint_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)__gnu_cxx::
                __normal_iterator<const_std::shared_ptr<tchecker::parsing::sync_constraint_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>_>
                ::operator*(&__end2);
    psVar1 = this->_system;
    peVar4 = std::
             __shared_ptr_access<tchecker::parsing::sync_constraint_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(_event);
    this_00 = parsing::sync_constraint_t::process(peVar4);
    psVar5 = parsing::process_declaration_t::name_abi_cxx11_(this_00);
    local_74 = processes_t::process_id(&psVar1->super_processes_t,psVar5);
    psVar1 = this->_system;
    peVar4 = std::
             __shared_ptr_access<tchecker::parsing::sync_constraint_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(_event);
    this_01 = parsing::sync_constraint_t::event(peVar4);
    psVar5 = parsing::event_declaration_t::name_abi_cxx11_(this_01);
    local_78 = events_t::event_id(&psVar1->super_events_t,psVar5);
    peVar4 = std::
             __shared_ptr_access<tchecker::parsing::sync_constraint_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(_event);
    local_7c = parsing::sync_constraint_t::strength(peVar4);
    std::
    vector<tchecker::system::sync_constraint_t,std::allocator<tchecker::system::sync_constraint_t>>
    ::emplace_back<unsigned_int&,unsigned_int&,tchecker::sync_strength_t>
              ((vector<tchecker::system::sync_constraint_t,std::allocator<tchecker::system::sync_constraint_t>>
                *)&__range2,&local_74,&local_78,&local_7c);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<tchecker::parsing::sync_constraint_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>_>
    ::operator++(&__end2);
  }
  psVar1 = this->_system;
  attributes = parsing::declaration_t::attributes
                         ((declaration_t *)
                          v.
                          super__Vector_base<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  attributes_t::attributes_t(&local_b8,attributes);
  system_t::add_synchronization
            (psVar1,(vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
                     *)&__range2,&local_b8);
  attributes_t::~attributes_t(&local_b8);
  std::
  vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
  ::~vector((vector<tchecker::system::sync_constraint_t,_std::allocator<tchecker::system::sync_constraint_t>_>
             *)&__range2);
  return;
}

Assistant:

virtual void visit(tchecker::parsing::sync_declaration_t const & d)
  {
    std::vector<tchecker::system::sync_constraint_t> v;
    for (std::shared_ptr<tchecker::parsing::sync_constraint_t> const & c : d.sync_constraints()) {
      tchecker::process_id_t pid = _system.process_id(c->process().name());
      tchecker::event_id_t event = _system.event_id(c->event().name());
      v.emplace_back(pid, event, c->strength());
    }

    _system.add_synchronization(v, d.attributes());
  }